

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall exe_reconstructor::sectioninfo::copydata(sectioninfo *this,ReadWriter_ptr *w)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar3;
  ByteVector buf;
  allocator_type local_49;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  peVar1 = (this->r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar3 = 0;
  (*peVar1->_vptr_ReadWriter[4])(peVar1,0);
  while( true ) {
    iVar2 = (*((this->r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_ReadWriter[6])();
    if (CONCAT44(extraout_var,iVar2) <= uVar3) break;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,0x10000,&local_49)
    ;
    peVar1 = (this->r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar2 = (*peVar1->_vptr_ReadWriter[2])
                      (peVar1,local_48._M_impl.super__Vector_impl_data._M_start,
                       (long)local_48._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_48._M_impl.super__Vector_impl_data._M_start);
    peVar1 = (w->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar1->_vptr_ReadWriter[3])
              (peVar1,local_48._M_impl.super__Vector_impl_data._M_start,
               CONCAT44(extraout_var_00,iVar2));
    uVar3 = uVar3 + CONCAT44(extraout_var_00,iVar2);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

void copydata(ReadWriter_ptr w)
        {
            uint64_t pos= 0;
            r->setpos(0);
            while (pos < r->size()) {
                ByteVector buf(65536);
                size_t n= r->read(&buf[0], buf.size());
                w->write(&buf[0], n);
                pos += n;
            }
        }